

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O3

void cmSHA256_Final(sha_byte *digest,SHA_CTX *context)

{
  int j;
  long lVar1;
  uint uVar2;
  
  if (context != (SHA_CTX *)0x0) {
    if (digest != (sha_byte *)0x0) {
      cmSHA256_Internal_Last(context);
      lVar1 = 0;
      do {
        uVar2 = *(uint *)((long)context + lVar1 * 4);
        uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        *(uint *)((long)context + lVar1 * 4) = uVar2;
        *(uint *)(digest + lVar1 * 4) = uVar2;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 8);
    }
    memset(context,0,0xd0);
    return;
  }
  __assert_fail("context != (SHA_CTX*)0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cm_sha2.c"
                ,0x437,"void cmSHA256_Final(sha_byte *, SHA_CTX *)");
}

Assistant:

void SHA256_Final(sha_byte digest[], SHA_CTX* context) {
	sha_word32	*d = (sha_word32*)digest;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha_byte*)0) {
		SHA256_Internal_Last(context);

		/* Save the hash data for output: */
#if BYTE_ORDER == LITTLE_ENDIAN
		{
			/* Convert TO host byte order */
			int	j;
			for (j = 0; j < (SHA256_DIGEST_LENGTH >> 2); j++) {
				REVERSE32(context->s256.state[j],context->s256.state[j]);
				*d++ = context->s256.state[j];
			}
		}
#else
		MEMCPY_BCOPY(d, context->s256.state, SHA256_DIGEST_LENGTH);
#endif
	}

	/* Clean up state data: */
	MEMSET_BZERO(context, sizeof(*context));
}